

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bounding_box.cc
# Opt level: O1

bool __thiscall draco::BoundingBox::IsValid(BoundingBox *this)

{
  float fVar1;
  bool bVar2;
  
  fVar1 = (this->min_point_).v_._M_elems[0];
  if ((((fVar1 != 3.4028235e+38) || (bVar2 = false, NAN(fVar1))) &&
      ((fVar1 = (this->min_point_).v_._M_elems[1], bVar2 = false, fVar1 != 3.4028235e+38 ||
       (NAN(fVar1))))) &&
     ((fVar1 = (this->min_point_).v_._M_elems[2], fVar1 != 3.4028235e+38 || (NAN(fVar1))))) {
    fVar1 = (this->max_point_).v_._M_elems[0];
    bVar2 = false;
    if (((fVar1 != -3.4028235e+38) || (NAN(fVar1))) &&
       ((fVar1 = (this->max_point_).v_._M_elems[1], fVar1 != -3.4028235e+38 || (NAN(fVar1))))) {
      bVar2 = (bool)(-((this->max_point_).v_._M_elems[2] != -3.4028235e+38) & 1);
    }
  }
  return bVar2;
}

Assistant:

const bool BoundingBox::IsValid() const {
  return GetMinPoint()[0] != std::numeric_limits<float>::max() &&
         GetMinPoint()[1] != std::numeric_limits<float>::max() &&
         GetMinPoint()[2] != std::numeric_limits<float>::max() &&
         GetMaxPoint()[0] != std::numeric_limits<float>::lowest() &&
         GetMaxPoint()[1] != std::numeric_limits<float>::lowest() &&
         GetMaxPoint()[2] != std::numeric_limits<float>::lowest();
}